

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_verifySolutionReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  type_conflict5 tVar1;
  Verbosity VVar2;
  element_type *peVar3;
  long in_RDI;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  redcostviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  boundviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol;
  Verbosity old_verbosity;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffbc8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbd0;
  longlong in_stack_fffffffffffffbd8;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffbe0;
  type_conflict5 local_411;
  Verbosity local_408;
  Verbosity local_404;
  undefined1 local_400 [80];
  undefined1 local_3b0 [80];
  undefined1 local_360 [80];
  undefined1 local_310 [72];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd38;
  Verbosity in_stack_fffffffffffffd40;
  Verbosity in_stack_fffffffffffffd44;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd48;
  undefined4 local_294;
  undefined1 local_290 [56];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffda8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdb0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdb8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffdc4;
  undefined1 in_stack_fffffffffffffdcf;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdd0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 uVar5;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe18;
  undefined4 local_198;
  undefined1 local_194 [80];
  undefined4 local_144;
  undefined1 local_140 [80];
  Verbosity local_f0;
  Verbosity local_ec [3];
  undefined8 local_e0;
  undefined4 *local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined4 *local_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined4 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined4 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 *local_10;
  undefined4 *local_8;
  
  if ((in_RDI != -8) && (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar2)) {
    local_ec[0] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
    local_f0 = INFO1;
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_f0);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffbc8);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_ec);
  }
  local_144 = 0;
  local_d0 = local_140;
  local_d8 = &local_144;
  local_e0 = 0;
  local_8 = local_d8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  local_198 = 0;
  local_b8 = local_194;
  local_c0 = &local_198;
  local_c8 = 0;
  local_10 = local_c0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  uVar5 = 0;
  local_a0 = &stack0xfffffffffffffe18;
  local_a8 = &stack0xfffffffffffffe14;
  local_b0 = 0;
  local_18 = local_a8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  uVar4 = 0;
  local_88 = &stack0xfffffffffffffdc4;
  local_90 = &stack0xfffffffffffffdc0;
  local_98 = 0;
  local_20 = local_90;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  local_294 = 0;
  local_70 = local_290;
  local_78 = &local_294;
  local_80 = 0;
  local_28 = local_78;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  getBoundViolation(in_stack_fffffffffffffd48,
                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                    in_stack_fffffffffffffd38);
  getRowViolation(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  getDualViolation(in_stack_fffffffffffffe18,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(uVar5,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08);
  getRedCostViolation(in_stack_fffffffffffffe18,
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT44(uVar5,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(in_RDI + 0x180));
  peVar3 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x615d75);
  Tolerances::floatingPointFeastol(peVar3);
  tVar1 = boost::multiprecision::operator>=
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffffbc8,(double *)0x615d9b);
  local_411 = true;
  if (!tVar1) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)(in_RDI + 0x180));
    peVar3 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x615dc5);
    Tolerances::floatingPointFeastol(peVar3);
    tVar1 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffbc8,(double *)0x615deb);
    local_411 = true;
    if (!tVar1) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(in_RDI + 0x180));
      peVar3 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x615e15);
      Tolerances::floatingPointOpttol(peVar3);
      tVar1 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffbc8,(double *)0x615e3b);
      local_411 = true;
      if (!tVar1) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI + 0x180));
        peVar3 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x615e61);
        Tolerances::floatingPointOpttol(peVar3);
        local_411 = boost::multiprecision::operator>=
                              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_fffffffffffffbc8,(double *)0x615e87);
      }
    }
  }
  if (local_411 != false) {
    if ((in_RDI != -8) && (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 4 < (int)VVar2)) {
      SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),(Verbosity *)&stack0xfffffffffffffd40);
      in_stack_fffffffffffffbc8 =
           (cpp_dec_float<100U,_int,_void> *)
           soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8)
      ;
      local_60 = local_310;
      local_68 = local_194;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffbd0,
                 in_stack_fffffffffffffbc8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffbc8);
      in_stack_fffffffffffffbd0 =
           (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,
                                 (char *)in_stack_fffffffffffffbc8);
      local_50 = local_360;
      local_58 = &stack0xfffffffffffffe18;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffbd0,
                 in_stack_fffffffffffffbc8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffbc8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
      local_40 = local_3b0;
      local_48 = &stack0xfffffffffffffdc4;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffbd0,
                 in_stack_fffffffffffffbc8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffbc8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
      local_30 = local_400;
      local_38 = local_290;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffbd0,
                 in_stack_fffffffffffffbc8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffbc8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffbc8);
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),(Verbosity *)&stack0xfffffffffffffd44);
    }
    if ((in_RDI != -8) && (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar2)) {
      local_404 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
      local_408 = INFO1;
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_408);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffbd0,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffbc8);
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_404);
    }
    if ((*(byte *)(in_RDI + 0x5701) & 1) != 0) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::unscaleLPandReloadBasis(in_stack_fffffffffffffbd0);
      *(undefined1 *)(in_RDI + 0x5701) = 0;
      *(int *)(in_RDI + 0x64d8) = *(int *)(in_RDI + 0x64d8) + 1;
    }
    _preprocessAndSolveReal
              (in_stack_fffffffffffffdd0,(bool)in_stack_fffffffffffffdcf,
               (bool *)CONCAT44(in_stack_fffffffffffffdc4,uVar4));
  }
  return;
}

Assistant:

void SoPlexBase<R>::_verifySolutionReal()
{
   assert(_hasSolReal);

   SPX_MSG_INFO1(spxout, spxout << " --- verifying computed solution" << std::endl;)

   R sumviol = 0;
   R boundviol = 0;
   R rowviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   (void) getBoundViolation(boundviol, sumviol);
   (void) getRowViolation(rowviol, sumviol);
   (void) getDualViolation(dualviol, sumviol);
   (void) getRedCostViolation(redcostviol, sumviol);

   if(boundviol >= _solver.tolerances()->floatingPointFeastol()
         || rowviol >= _solver.tolerances()->floatingPointFeastol()
         || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << "bound violation: " << boundviol
                    << ", row violation: " << rowviol
                    << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}